

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plaMan.c
# Opt level: O0

Pla_Man_t * Pla_ManPrimesDetector(int nVars)

{
  Vec_Int_t *vMints_00;
  Pla_Man_t *pPVar1;
  Vec_Int_t *vMints;
  Pla_Man_t *p;
  char pName [1000];
  int nVars_local;
  
  pName._996_4_ = nVars;
  vMints_00 = Pla_GenPrimes(nVars);
  sprintf((char *)&p,"primes%02d",(ulong)(uint)pName._996_4_);
  pPVar1 = Pla_GenFromMinterms((char *)&p,vMints_00,pName._996_4_);
  Vec_IntFree(vMints_00);
  return pPVar1;
}

Assistant:

Pla_Man_t * Pla_ManPrimesDetector( int nVars )
{
    char pName[1000];
    Pla_Man_t * p;
    Vec_Int_t * vMints = Pla_GenPrimes( nVars );
    sprintf( pName, "primes%02d", nVars );
    p = Pla_GenFromMinterms( pName, vMints, nVars );
    Vec_IntFree( vMints );
    return p;
}